

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_createCCtxParams_advanced(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_CCtx_params *params;
  
  if ((in_stack_00000008 == (ZSTD_allocFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    customMem_00.customFree = (ZSTD_freeFunction)customMem.customAlloc;
    customMem_00.customAlloc = in_stack_00000008;
    customMem_00.opaque = customMem.customFree;
    params = (ZSTD_CCtx_params *)ZSTD_calloc(0x80,customMem_00);
    if (params == (ZSTD_CCtx_params *)0x0) {
      params = (ZSTD_CCtx_params *)0x0;
    }
    else {
      (params->customMem).customAlloc = in_stack_00000008;
      (params->customMem).customFree = (ZSTD_freeFunction)customMem.customAlloc;
      *(undefined1 (*) [16])&(params->customMem).opaque = customMem._8_16_;
      params->compressionLevel = 3;
      (params->fParams).contentSizeFlag = 1;
    }
  }
  else {
    params = (ZSTD_CCtx_params *)0x0;
  }
  return params;
}

Assistant:

static ZSTD_CCtx_params* ZSTD_createCCtxParams_advanced(
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params* params;
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    params = (ZSTD_CCtx_params*)ZSTD_calloc(
            sizeof(ZSTD_CCtx_params), customMem);
    if (!params) { return NULL; }
    params->customMem = customMem;
    params->compressionLevel = ZSTD_CLEVEL_DEFAULT;
    params->fParams.contentSizeFlag = 1;
    return params;
}